

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool __thiscall duckdb::LineError::HandleErrors(LineError *this,StringValueResult *result)

{
  FullLinePosition *this_00;
  pointer pCVar1;
  pointer pCVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  byte bVar6;
  bool bVar7;
  CSVFileScan *pCVar8;
  reference type;
  InvalidInputException *this_01;
  CurrentError *cur_error;
  pointer pCVar9;
  LogicalTypeId LVar10;
  vector<duckdb::CurrentError,_true> *__range1;
  ulong uVar11;
  CSVReaderOptions *pCVar12;
  LinePosition *other;
  LinesPerBoundary error_info_01;
  LinesPerBoundary error_info_02;
  LinesPerBoundary error_info_03;
  LinesPerBoundary error_info_04;
  LinesPerBoundary error_info_05;
  LinesPerBoundary error_info_06;
  LinesPerBoundary error_info_07;
  LinesPerBoundary error_info_08;
  LinesPerBoundary error_info_09;
  optional_idx in_stack_fffffffffffffd68;
  undefined4 uVar13;
  string *psVar14;
  string *in_stack_fffffffffffffd78;
  bool first_nl;
  CSVReaderOptions *local_278;
  string *local_270;
  CSVReaderOptions *local_268;
  optional_idx local_260;
  LineError *local_258;
  LinePosition *local_250;
  LinesPerBoundary lines_per_batch;
  string borked_line;
  string column_name;
  optional_idx local_1c8;
  optional_idx local_1c0;
  optional_idx local_1b8;
  optional_idx local_1b0;
  optional_idx local_1a8;
  optional_idx local_1a0;
  optional_idx local_198;
  optional_idx local_190;
  optional_idx local_188;
  optional_idx local_180;
  string *local_178;
  idx_t iStack_170;
  string *local_168;
  _Alloc_hider _Stack_160;
  CSVError local_150;
  CSVError csv_error;
  
  pCVar2 = (this->current_errors).
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = 0;
  pCVar1 = (this->current_errors).
           super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
           super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pCVar9 = pCVar1; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1) {
    bVar6 = bVar6 | pCVar9->type == INVALID_UNICODE;
  }
  if ((((this->ignore_errors == false) && ((bVar6 & result->sniffing) == 0)) ||
      (this->is_error_in_line != true)) || (result->figure_out_new_line != false)) {
    this_00 = &result->current_line_position;
    local_260.index = (idx_t)&result->path;
    other = &pCVar1->error_position;
    local_258 = this;
    while( true ) {
      uVar13 = (undefined4)(in_stack_fffffffffffffd68.index >> 0x20);
      if ((pointer)&other[-3].buffer_size == pCVar2) break;
      LinesPerBoundary::LinesPerBoundary
                (&lines_per_batch,(result->iterator->boundary).boundary_idx,*result->lines_read);
      first_nl = false;
      bVar7 = StringValueResult::PrintErrorLine(result);
      FullLinePosition::
      ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                (&borked_line,this_00,&first_nl,&result->buffer_handles,bVar7);
      psVar14 = (string *)0x1896704;
      CSVError::CSVError(&csv_error);
      bVar6 = (byte)other[-3].buffer_size;
      if (9 < bVar6) {
switchD_01896725_caseD_1:
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_150,"CSV Error not allowed when inserting row",
                   (allocator *)&column_name);
        InvalidInputException::InvalidInputException(this_01,(string *)&local_150);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar12 = (CSVReaderOptions *)other[-3].buffer_idx;
      switch(bVar6) {
      case 0:
        column_name._M_dataplus._M_p = (pointer)&column_name.field_2;
        column_name._M_string_length = 0;
        column_name.field_2._M_local_buf[0] = '\0';
        if (pCVar12 < (CSVReaderOptions *)
                      ((long)(result->names).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->names).
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::get<true>(&result->names,(size_type)pCVar12);
          ::std::__cxx11::string::_M_assign((string *)&column_name);
          pCVar12 = (CSVReaderOptions *)other[-3].buffer_idx;
        }
        if (pCVar12 < (CSVReaderOptions *)(ulong)result->number_of_columns) {
          LVar10 = *(LogicalTypeId *)
                    ((long)((result->parse_types).
                            super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                            .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                           other[-2].buffer_pos) + 1);
        }
        else {
          LVar10 = INVALID;
        }
        bVar7 = LinePosition::operator==(&this_00->begin,other);
        local_268 = (CSVReaderOptions *)CONCAT44(local_268._4_4_,(uint)LVar10);
        if (bVar7) {
          local_278 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)other[-3].buffer_idx;
          local_168 = (string *)lines_per_batch.boundary_idx;
          _Stack_160._M_p = (pointer)lines_per_batch.lines_in_batch;
          iVar3 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar4 = (result->current_line_position).begin.buffer_pos;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          optional_idx::optional_idx
                    (&local_1b0,other->buffer_pos + uVar11 + other->buffer_idx * iVar3);
          in_stack_fffffffffffffd68.index._4_4_ = uVar13;
          in_stack_fffffffffffffd68.index._0_4_ = local_268._0_4_;
          error_info.lines_in_batch = iVar5 * iVar3 + iVar4 + uVar11;
          error_info.boundary_idx = (idx_t)_Stack_160._M_p;
          CSVError::CastError(&local_150,(CSVError *)local_278,(CSVReaderOptions *)&column_name,
                              (string *)&other[-2].buffer_idx,local_270,(idx_t)&borked_line,
                              local_168,error_info,local_1b0.index,in_stack_fffffffffffffd68,
                              (LogicalTypeId)local_260.index,in_stack_fffffffffffffd78);
        }
        else {
          local_278 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)other[-3].buffer_idx;
          local_178 = (string *)lines_per_batch.boundary_idx;
          iStack_170 = lines_per_batch.lines_in_batch;
          iVar3 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar4 = (result->current_line_position).begin.buffer_pos;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          optional_idx::optional_idx(&local_1b8,other->buffer_idx * iVar3 + other->buffer_pos);
          in_stack_fffffffffffffd68.index._4_4_ = uVar13;
          in_stack_fffffffffffffd68.index._0_4_ = local_268._0_4_;
          error_info_00.lines_in_batch = iVar5 * iVar3 + iVar4 + uVar11;
          error_info_00.boundary_idx = iStack_170;
          CSVError::CastError(&local_150,(CSVError *)local_278,(CSVReaderOptions *)&column_name,
                              (string *)&other[-2].buffer_idx,local_270,(idx_t)&borked_line,
                              local_178,error_info_00,local_1b8.index,in_stack_fffffffffffffd68,
                              (LogicalTypeId)local_260.index,in_stack_fffffffffffffd78);
        }
        CSVError::operator=(&csv_error,&local_150);
        CSVError::~CSVError(&local_150);
        ::std::__cxx11::string::~string((string *)&column_name);
        this = local_258;
        break;
      default:
        goto switchD_01896725_caseD_1;
      case 2:
      case 3:
        local_268 = pCVar12;
        bVar7 = LinePosition::operator==(&this_00->begin,other);
        if (bVar7) {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x189679c;
          local_250 = other;
          optional_idx::optional_idx
                    (&local_180,other->buffer_pos + uVar11 + other->buffer_idx * iVar4);
          error_info_02.lines_in_batch = (idx_t)&borked_line;
          error_info_02.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::IncorrectColumnAmountError
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_02,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_180.index,local_260,psVar14);
        }
        else {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x1896836;
          local_250 = other;
          optional_idx::optional_idx(&local_188,other->buffer_idx * iVar4 + other->buffer_pos);
          error_info_03.lines_in_batch = (idx_t)&borked_line;
          error_info_03.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::IncorrectColumnAmountError
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_03,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_188.index,local_260,psVar14);
        }
        goto LAB_01896df1;
      case 4:
        local_268 = pCVar12;
        bVar7 = LinePosition::operator==(&this_00->begin,other);
        if (bVar7) {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x1896b6a;
          local_250 = other;
          optional_idx::optional_idx
                    (&local_1a0,other->buffer_pos + uVar11 + other->buffer_idx * iVar4);
          error_info_06.lines_in_batch = (idx_t)&borked_line;
          error_info_06.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::UnterminatedQuotesError
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_06,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_1a0.index,local_260,psVar14);
        }
        else {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x1896dab;
          local_250 = other;
          optional_idx::optional_idx(&local_1a8,other->buffer_idx * iVar4 + other->buffer_pos);
          error_info_09.lines_in_batch = (idx_t)&borked_line;
          error_info_09.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::UnterminatedQuotesError
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_09,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_1a8.index,local_260,psVar14);
        }
        goto LAB_01896df1;
      case 6:
        error_info_01.lines_in_batch = (idx_t)&borked_line;
        error_info_01.boundary_idx = lines_per_batch.lines_in_batch;
        in_stack_fffffffffffffd68.index = local_260.index;
        CSVError::LineSizeError
                  (&local_150,(CSVError *)((result->super_ScannerResult).state_machine)->options,
                   (CSVReaderOptions *)lines_per_batch.boundary_idx,error_info_01,
                   (string *)
                   ((ulong)first_nl + (result->current_line_position).begin.buffer_pos +
                   (result->current_line_position).begin.buffer_idx * result->requested_size),
                   local_260.index,psVar14);
        CSVError::operator=(&csv_error,&local_150);
        CSVError::~CSVError(&local_150);
        this = local_258;
        break;
      case 8:
        local_268 = pCVar12;
        bVar7 = LinePosition::operator==(&this_00->begin,other);
        if (bVar7) {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x18968f9;
          local_250 = other;
          optional_idx::optional_idx
                    (&local_190,other->buffer_pos + uVar11 + other->buffer_idx * iVar4);
          error_info_04.lines_in_batch = (idx_t)&borked_line;
          error_info_04.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::InvalidUTF8
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_04,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_190.index,local_260,psVar14);
        }
        else {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x1896c04;
          local_250 = other;
          optional_idx::optional_idx(&local_198,other->buffer_idx * iVar4 + other->buffer_pos);
          error_info_07.lines_in_batch = (idx_t)&borked_line;
          error_info_07.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::InvalidUTF8
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_07,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_198.index,local_260,psVar14);
        }
        CSVError::operator=(&csv_error,&local_150);
        CSVError::~CSVError(&local_150);
        this = local_258;
        pCVar8 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(&result->csv_file_scan);
        other = local_250;
        type = vector<duckdb::LogicalType,_true>::get<true>
                         (&pCVar8->file_types,(size_type)local_268);
        bVar7 = StringValueScanner::CanDirectlyCast(type,result->icu_loaded);
        if (!bVar7) {
          result->number_of_rows = result->number_of_rows + -1;
        }
        break;
      case 9:
        local_268 = pCVar12;
        bVar7 = LinePosition::operator==(&this_00->begin,other);
        if (bVar7) {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x1896a3a;
          local_250 = other;
          optional_idx::optional_idx
                    (&local_1c0,other->buffer_pos + uVar11 + other->buffer_idx * iVar4);
          error_info_05.lines_in_batch = (idx_t)&borked_line;
          error_info_05.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::InvalidState
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_05,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_1c0.index,local_260,psVar14);
        }
        else {
          iVar3 = (result->current_line_position).begin.buffer_pos;
          pCVar12 = ((result->super_ScannerResult).state_machine)->options;
          local_270 = (string *)lines_per_batch.boundary_idx;
          local_278 = (CSVReaderOptions *)lines_per_batch.lines_in_batch;
          iVar4 = result->requested_size;
          uVar11 = (ulong)first_nl;
          iVar5 = (result->current_line_position).begin.buffer_idx;
          psVar14 = (string *)0x1896d11;
          local_250 = other;
          optional_idx::optional_idx(&local_1c8,other->buffer_idx * iVar4 + other->buffer_pos);
          error_info_08.lines_in_batch = (idx_t)&borked_line;
          error_info_08.boundary_idx = (idx_t)local_278;
          in_stack_fffffffffffffd68.index = local_260.index;
          CSVError::InvalidState
                    (&local_150,(CSVError *)pCVar12,local_268,(idx_t)local_270,error_info_08,
                     (string *)(iVar5 * iVar4 + iVar3 + uVar11),local_1c8.index,local_260,psVar14);
        }
LAB_01896df1:
        CSVError::operator=(&csv_error,&local_150);
        CSVError::~CSVError(&local_150);
        this = local_258;
        other = local_250;
      }
      CSVErrorHandler::Error(result->error_handler,&csv_error,false);
      CSVError::~CSVError(&csv_error);
      ::std::__cxx11::string::~string((string *)&borked_line);
      other = (LinePosition *)&other[3].buffer_idx;
    }
    if (this->is_error_in_line != true) {
      return false;
    }
    if (this->scan_id == 0xffffffffffffffff) {
      return false;
    }
    if (result->sniffing == true) {
      StringValueResult::RemoveLastLine(result);
    }
    else {
      csv_error.error_message._M_dataplus._M_p = (pointer)result->number_of_rows;
      ::std::__detail::
      _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&result->borked_rows,(value_type *)&csv_error);
      result->cur_col_id = 0;
      result->chunk_col_id = 0;
    }
  }
  else {
    StringValueResult::RemoveLastLine(result);
  }
  Reset(this);
  return true;
}

Assistant:

bool LineError::HandleErrors(StringValueResult &result) {
	bool skip_sniffing = false;
	for (auto &cur_error : current_errors) {
		if (cur_error.type == CSVErrorType::INVALID_UNICODE) {
			skip_sniffing = true;
		}
	}
	skip_sniffing = result.sniffing && skip_sniffing;

	if ((ignore_errors || skip_sniffing) && is_error_in_line && !result.figure_out_new_line) {
		result.RemoveLastLine();
		Reset();
		return true;
	}
	// Reconstruct CSV Line
	for (auto &cur_error : current_errors) {
		LinesPerBoundary lines_per_batch(result.iterator.GetBoundaryIdx(), result.lines_read);
		bool first_nl = false;
		auto borked_line = result.current_line_position.ReconstructCurrentLine(first_nl, result.buffer_handles,
		                                                                       result.PrintErrorLine());
		CSVError csv_error;
		auto col_idx = cur_error.col_idx;
		auto &line_pos = cur_error.error_position;

		switch (cur_error.type) {
		case TOO_MANY_COLUMNS:
		case TOO_FEW_COLUMNS:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::IncorrectColumnAmountError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::IncorrectColumnAmountError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		case INVALID_UNICODE: {
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::InvalidUTF8(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::InvalidUTF8(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			if (!StringValueScanner::CanDirectlyCast(result.csv_file_scan->file_types[col_idx], result.icu_loaded)) {
				result.number_of_rows--;
			}
			break;
		}
		case UNTERMINATED_QUOTES:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::UnterminatedQuotesError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::UnterminatedQuotesError(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		case CAST_ERROR: {
			string column_name;
			LogicalTypeId type_id = LogicalTypeId::INVALID;
			if (cur_error.col_idx < result.names.size()) {
				column_name = result.names[cur_error.col_idx];
			}
			if (cur_error.col_idx < result.number_of_columns) {
				type_id = result.parse_types[cur_error.chunk_idx].type_id;
			}
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::CastError(
				    result.state_machine.options, column_name, cur_error.error_message, cur_error.col_idx, borked_line,
				    lines_per_batch,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), type_id, result.path);
			} else {
				csv_error = CSVError::CastError(
				    result.state_machine.options, column_name, cur_error.error_message, cur_error.col_idx, borked_line,
				    lines_per_batch,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), type_id, result.path);
			}
		} break;
		case MAXIMUM_LINE_SIZE:
			csv_error = CSVError::LineSizeError(
			    result.state_machine.options, lines_per_batch, borked_line,
			    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl), result.path);
			break;
		case INVALID_STATE:
			if (result.current_line_position.begin == line_pos) {
				csv_error = CSVError::InvalidState(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size, first_nl), result.path);
			} else {
				csv_error = CSVError::InvalidState(
				    result.state_machine.options, col_idx, lines_per_batch, borked_line,
				    result.current_line_position.begin.GetGlobalPosition(result.requested_size, first_nl),
				    line_pos.GetGlobalPosition(result.requested_size), result.path);
			}
			break;
		default:
			throw InvalidInputException("CSV Error not allowed when inserting row");
		}
		result.error_handler.Error(csv_error);
	}
	if (is_error_in_line && scan_id != StringValueScanner::LINE_FINDER_ID) {
		if (result.sniffing) {
			// If we are sniffing we just remove the line
			result.RemoveLastLine();
		} else {
			// Otherwise, we add it to the borked rows to remove it later and just cleanup the column variables.
			result.borked_rows.insert(static_cast<idx_t>(result.number_of_rows));
			result.cur_col_id = 0;
			result.chunk_col_id = 0;
		}
		Reset();
		return true;
	}
	return false;
}